

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# parser.h
# Opt level: O0

void __thiscall mjs::postfix_expression::~postfix_expression(postfix_expression *this)

{
  postfix_expression *this_local;
  
  (this->super_expression).super_syntax_node._vptr_syntax_node =
       (_func_int **)&PTR__postfix_expression_002ba548;
  std::unique_ptr<mjs::expression,_std::default_delete<mjs::expression>_>::~unique_ptr(&this->e_);
  expression::~expression(&this->super_expression);
  return;
}

Assistant:

explicit postfix_expression(const source_extend& extend, token_type op, expression_ptr&& e) : expression(extend), op_(op), e_(std::move(e)) {
        assert(e_);
    }